

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScene::mouseMoveEvent(QGraphicsScene *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QGraphicsScenePrivate *this_00;
  bool bVar1;
  QFlagsStorage<Qt::MouseButton> QVar2;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  if ((this_00->mouseGrabberItems).d.size == 0) {
    QVar2.i = (Int)QGraphicsSceneMouseEvent::buttons(mouseEvent);
    if ((QFlagsStorage<Qt::MouseButton>)QVar2.i == (QFlagsStorage<Qt::MouseButton>)0x0) {
      local_28.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)&local_38,None)
      ;
      _q_hoverFromMouseEvent((QGraphicsSceneHoverEvent *)&local_38,mouseEvent);
      bVar1 = QGraphicsScenePrivate::dispatchHoverEvent
                        (this_00,(QGraphicsSceneHoverEvent *)&local_38);
      (**(code **)(*(long *)&mouseEvent->super_QGraphicsSceneEvent + 0x10))(mouseEvent,bVar1);
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_38);
    }
  }
  else {
    QGraphicsScenePrivate::sendMouseEvent(this_00,mouseEvent);
    (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::mouseMoveEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_D(QGraphicsScene);
    if (d->mouseGrabberItems.isEmpty()) {
        if (mouseEvent->buttons())
            return;
        QGraphicsSceneHoverEvent hover;
        _q_hoverFromMouseEvent(&hover, mouseEvent);
        mouseEvent->setAccepted(d->dispatchHoverEvent(&hover));
        return;
    }

    // Forward the event to the mouse grabber
    d->sendMouseEvent(mouseEvent);
    mouseEvent->accept();
}